

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O0

string * __thiscall
pbrt::DiffuseTransmissionMaterial::ToString_abi_cxx11_(DiffuseTransmissionMaterial *this)

{
  string *in_RDI;
  SpectrumTextureHandle *in_stack_00000010;
  SpectrumTextureHandle *in_stack_00000018;
  FloatTextureHandle *in_stack_00000020;
  char *in_stack_00000028;
  
  StringPrintf<pbrt::FloatTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::FloatTextureHandle_const&>
            (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010,
             &this->displacement);
  return in_RDI;
}

Assistant:

std::string DiffuseTransmissionMaterial::ToString() const {
    return StringPrintf("[ DiffuseTransmissionMaterial displacment: %s reflectance: %s "
                        "transmittance: %s sigma: %s ]",
                        displacement, reflectance, transmittance, sigma);
}